

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

Arg * __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::get_arg
          (Arg *__return_storage_ptr__,BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,
          BasicStringRef<char> arg_name,char **error)

{
  undefined4 uVar1;
  bool bVar2;
  ArgList *ctx;
  Arg *pAVar3;
  Arg *arg;
  char **error_local;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> *this_local;
  BasicStringRef<char> arg_name_local;
  
  arg_name_local.data_ = (char *)arg_name.size_;
  this_local = (BasicFormatter<char,_fmt::ArgFormatter<char>_> *)arg_name.data_;
  bVar2 = internal::FormatterBase::check_no_auto_index(&this->super_FormatterBase,error);
  if (bVar2) {
    ctx = internal::FormatterBase::args(&this->super_FormatterBase);
    internal::ArgMap<char>::init(&this->map_,(EVP_PKEY_CTX *)ctx);
    pAVar3 = internal::ArgMap<char>::find(&this->map_,(BasicStringRef<char> *)&this_local);
    if (pAVar3 != (Arg *)0x0) {
      (__return_storage_ptr__->super_Value).field_0.long_long_value =
           (pAVar3->super_Value).field_0.long_long_value;
      (__return_storage_ptr__->super_Value).field_0.string.size =
           (pAVar3->super_Value).field_0.string.size;
      uVar1 = *(undefined4 *)&pAVar3->field_0x14;
      __return_storage_ptr__->type = pAVar3->type;
      *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar1;
      *(undefined8 *)&__return_storage_ptr__->field_0x18 = *(undefined8 *)&pAVar3->field_0x18;
      return __return_storage_ptr__;
    }
    *error = "argument not found";
  }
  memset(__return_storage_ptr__,0,0x20);
  return __return_storage_ptr__;
}

Assistant:

inline internal::Arg BasicFormatter<Char, AF>::get_arg(
    BasicStringRef<Char> arg_name, const char *&error) {
  if (check_no_auto_index(error)) {
    map_.init(args());
    const internal::Arg *arg = map_.find(arg_name);
    if (arg)
      return *arg;
    error = "argument not found";
  }
  return internal::Arg();
}